

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_randomShuffleSeedIsPrintedAndRandFuncIsExercised_Test::
~TEST_CommandLineTestRunner_randomShuffleSeedIsPrintedAndRandFuncIsExercised_Test
          (TEST_CommandLineTestRunner_randomShuffleSeedIsPrintedAndRandFuncIsExercised_Test *this)

{
  TEST_CommandLineTestRunner_randomShuffleSeedIsPrintedAndRandFuncIsExercised_Test *this_local;
  
  ~TEST_CommandLineTestRunner_randomShuffleSeedIsPrintedAndRandFuncIsExercised_Test(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(CommandLineTestRunner, randomShuffleSeedIsPrintedAndRandFuncIsExercised)
{
    // more than 1 item in test list ensures that shuffle algorithm calls rand_()
    UtestShell *anotherTest = new UtestShell("group", "test2", "file", 1);
    registry.addTest(anotherTest);

    const char* argv[] = { "tests.exe", "-s"};
    SimpleString text = runAndGetOutput(2, argv);
    STRCMP_CONTAINS("shuffling enabled with seed:", text.asCharString());

    delete anotherTest;
}